

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

void free_file_expr(gvisitor_t *self,gnode_file_expr_t *node)

{
  char *local_40;
  char *local_38;
  char *val;
  size_t _i;
  size_t _len;
  gnode_file_expr_t *node_local;
  gvisitor_t *self_local;
  
  if ((node->base).refcount == 0) {
    if (node->identifiers == (cstring_r *)0x0) {
      local_38 = (char *)0x0;
    }
    else {
      local_38 = (char *)node->identifiers->n;
    }
    for (val = (char *)0x0; val < local_38; val = val + 1) {
      if (val < (char *)node->identifiers->n) {
        local_40 = node->identifiers->p[(long)val];
      }
      else {
        local_40 = (char *)0x0;
      }
      free(local_40);
    }
    if (node->identifiers != (cstring_r *)0x0) {
      if (node->identifiers->p != (char **)0x0) {
        free(node->identifiers->p);
      }
      free(node->identifiers);
    }
    free(node);
  }
  else {
    (node->base).refcount = (node->base).refcount - 1;
  }
  return;
}

Assistant:

static void free_file_expr (gvisitor_t *self, gnode_file_expr_t *node) {
    #pragma unused(self)
    CHECK_REFCOUNT(node);
    cstring_array_each(node->identifiers, {
        mem_free((void *)val);
    });

    if (node->identifiers) gnode_array_free(node->identifiers);
    mem_free((void *)node);
}